

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

string * __thiscall
higan::HttpResponse::StatusCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,HttpResponse *this,StatusCode status_code)

{
  int iVar1;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"500 Internal Server Error",&local_21);
  iVar1 = (int)this;
  if ((((iVar1 == 500) || (iVar1 == 400)) || (iVar1 == 0x194)) || (iVar1 == 200)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpResponse::StatusCodeToString(HttpResponse::StatusCode status_code)
{
	std::string result = "500 Internal Server Error";
	switch (status_code)
	{
		case STATUS_200_OK:
			result = "200 OK";
			break;
		case STATUS_400_BAD_REQUEST:
			result = "400 Bad Request";
			break;
		case STATUS_404_NOT_FOUND:
			result = "404 Not Found";
			break;
		case STATUS_500_SERVICE_ERROR:
			result = "500 Internal Server Error";
			break;
	}

	return result;
}